

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbolize.cpp
# Opt level: O1

void WTF::SafeAppendString(char *source,char *dest,int dest_size)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  
  sVar2 = strlen(dest);
  iVar1 = (int)sVar2;
  iVar3 = dest_size - iVar1;
  if (iVar3 != 0 && iVar1 <= dest_size) {
    strncpy(dest + iVar1,source,(long)iVar3);
    (dest + iVar1)[(long)iVar3 - 1] = '\0';
    return;
  }
  abort();
}

Assistant:

void SafeAppendString(const char* source, char* dest, int dest_size) {
  int dest_string_length = strlen(dest);
  SAFE_ASSERT(dest_string_length < dest_size);
  dest += dest_string_length;
  dest_size -= dest_string_length;
  strncpy(dest, source, dest_size);
  // Making sure |dest| is always null-terminated.
  dest[dest_size - 1] = '\0';
}